

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O3

void __thiscall iu_AssertionTest_x_iutest_x_GE_Test::Body(iu_AssertionTest_x_iutest_x_GE_Test *this)

{
  return;
}

Assistant:

IUTEST(AssertionTest, GE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_GE(x0, y0);
    IUTEST_EXPECT_GE(f1, f0);
    IUTEST_INFORM_GE(0x1, 0.0f);
    IUTEST_INFORM_GE(d1, d0);
}